

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_next(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint tr;
  ulong uVar2;
  TRef *pTVar3;
  TRef TVar4;
  int iVar5;
  cTValue *key;
  RecordIndex ix;
  TValue local_68;
  uint32_t local_60;
  uint local_38;
  TRef local_34;
  TRef local_30;
  undefined4 local_28;
  uint local_24;
  
  uVar1 = *J->base;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    tr = J->base[1];
    local_38 = uVar1;
    if ((tr & 0x1f000000) == 0) {
      local_34 = lj_ir_kint(J,0);
      key = (cTValue *)&J[-1].penalty[0x32].val;
    }
    else {
      TVar4 = recff_tmpref(J,tr,1);
      local_34 = lj_ir_call(J,IRCALL_lj_tab_keyindex,(ulong)uVar1,(ulong)TVar4);
      key = rd->argv + 1;
    }
    local_68 = (TValue)rd->argv->u64;
    local_60 = lj_tab_keyindex((GCtab *)(local_68.u64 & 0x7fffffffffff),key);
    local_24 = 0;
    if ((J->framedepth != 0) && (uVar2 = J->L->base[-1].u64, (uVar2 & 3) == 0)) {
      local_24 = (uint)(*(byte *)(uVar2 - 1) - 1 < 2);
    }
    local_28 = 0;
    iVar5 = lj_record_next(J,(RecordIndex *)&local_68.gcr);
    rd->nres = (long)iVar5;
    pTVar3 = J->base;
    *pTVar3 = local_34;
    pTVar3[1] = local_30;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_next(jit_State *J, RecordFFData *rd)
{
#if LJ_BE
  /* YAGNI: Disabled on big-endian due to issues with lj_vm_next,
  ** IR_HIOP, RID_RETLO/RID_RETHI and ra_destpair.
  */
  recff_nyi(J, rd);
#else
  TRef tab = J->base[0];
  if (tref_istab(tab)) {
    RecordIndex ix;
    cTValue *keyv;
    ix.tab = tab;
    if (tref_isnil(J->base[1])) {  /* Shortcut for start of traversal. */
      ix.key = lj_ir_kint(J, 0);
      keyv = niltvg(J2G(J));
    } else {
      TRef tmp = recff_tmpref(J, J->base[1], IRTMPREF_IN1);
      ix.key = lj_ir_call(J, IRCALL_lj_tab_keyindex, tab, tmp);
      keyv = &rd->argv[1];
    }
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    ix.keyv.u32.lo = lj_tab_keyindex(tabV(&ix.tabv), keyv);
    /* Omit the value, if not used by the caller. */
    ix.idxchain = (J->framedepth && frame_islua(J->L->base-1) &&
		   bc_b(frame_pc(J->L->base-1)[-1])-1 < 2);
    ix.mobj = 0;  /* We don't need the next index. */
    rd->nres = lj_record_next(J, &ix);
    J->base[0] = ix.key;
    J->base[1] = ix.val;
  }  /* else: Interpreter will throw. */
#endif
}